

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O3

bool updateValueDistribution(double value,HighsValueDistribution *value_distribution)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar2 = value_distribution->num_count_;
  uVar3 = (ulong)uVar2;
  if (-1 < (int)uVar2) {
    value_distribution->sum_count_ = value_distribution->sum_count_ + 1;
    dVar6 = ABS(value);
    uVar4 = -(ulong)(value_distribution->min_value_ < dVar6);
    uVar5 = -(ulong)(dVar6 < value_distribution->max_value_);
    value_distribution->min_value_ =
         (double)(~uVar4 & (ulong)dVar6 | (ulong)value_distribution->min_value_ & uVar4);
    value_distribution->max_value_ =
         (double)(~uVar5 & (ulong)dVar6 | (ulong)value_distribution->max_value_ & uVar5);
    if ((value != 0.0) || (NAN(value))) {
      if ((dVar6 != 1.0) || (NAN(dVar6))) {
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            if (dVar6 < (value_distribution->limit_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4]) {
              piVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar4;
              *piVar1 = *piVar1 + 1;
              goto LAB_0038022a;
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        piVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        *piVar1 = *piVar1 + 1;
      }
      else {
        value_distribution->num_one_ = value_distribution->num_one_ + 1;
      }
    }
    else {
      value_distribution->num_zero_ = value_distribution->num_zero_ + 1;
    }
  }
LAB_0038022a:
  return -1 < (int)uVar2;
}

Assistant:

bool updateValueDistribution(const double value,
                             HighsValueDistribution& value_distribution) {
  if (value_distribution.num_count_ < 0) return false;
  value_distribution.sum_count_++;
  const double abs_value = fabs(value);
  value_distribution.min_value_ =
      std::min(abs_value, value_distribution.min_value_);
  value_distribution.max_value_ =
      std::max(abs_value, value_distribution.max_value_);
  if (!abs_value) {
    value_distribution.num_zero_++;
    return true;
  }
  if (abs_value == 1.0) {
    value_distribution.num_one_++;
    return true;
  }
  for (HighsInt i = 0; i < value_distribution.num_count_; i++) {
    if (abs_value < value_distribution.limit_[i]) {
      value_distribution.count_[i]++;
      return true;
    }
  }
  value_distribution.count_[value_distribution.num_count_]++;
  return true;
}